

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeGravityForces
          (ChElementHexaANCF_3843 *this,ChVectorDynamic<> *Fg,ChVector<double> *G_acc)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double *pdVar8;
  long lVar9;
  ActualDstType actualDst;
  undefined1 auVar10 [64];
  double adStack_580 [32];
  double adStack_480 [31];
  code *pcStack_388;
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  if ((Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows == 0x60)
  {
    auVar1 = *(undefined1 (*) [64])
              (this->m_GravForceScale).
              super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = G_acc->m_data[0];
    auVar10 = vbroadcastsd_avx512f(auVar5);
    local_380 = vmulpd_avx512f(auVar1,auVar10);
    auVar2 = *(undefined1 (*) [64])
              ((this->m_GravForceScale).
               super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
              + 8);
    local_340 = vmulpd_avx512f(auVar2,auVar10);
    auVar3 = *(undefined1 (*) [64])
              ((this->m_GravForceScale).
               super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
              + 0x10);
    local_300 = vmulpd_avx512f(auVar10,auVar3);
    auVar4 = *(undefined1 (*) [64])
              ((this->m_GravForceScale).
               super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
              + 0x18);
    local_2c0 = vmulpd_avx512f(auVar10,auVar4);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = G_acc->m_data[1];
    auVar10 = vbroadcastsd_avx512f(auVar6);
    local_280 = vmulpd_avx512f(auVar1,auVar10);
    local_240 = vmulpd_avx512f(auVar2,auVar10);
    local_200 = vmulpd_avx512f(auVar3,auVar10);
    local_1c0 = vmulpd_avx512f(auVar4,auVar10);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = G_acc->m_data[2];
    auVar10 = vbroadcastsd_avx512f(auVar7);
    local_180 = vmulpd_avx512f(auVar1,auVar10);
    local_140 = vmulpd_avx512f(auVar2,auVar10);
    local_100 = vmulpd_avx512f(auVar3,auVar10);
    local_c0 = vmulpd_avx512f(auVar4,auVar10);
    pdVar8 = (Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
             2;
    lVar9 = 0x40;
    do {
      pdVar8[-2] = adStack_580[lVar9];
      pdVar8[-1] = adStack_480[lVar9];
      *pdVar8 = *(double *)(local_380 + lVar9 * 8);
      lVar9 = lVar9 + 1;
      pdVar8 = pdVar8 + 3;
    } while (lVar9 != 0x60);
    return;
  }
  pcStack_388 = ComputeGravityForces;
  __assert_fail("Fg.size() == 3 * NSF",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementHexaANCF_3843.cpp"
                ,0x1f2,
                "virtual void chrono::fea::ChElementHexaANCF_3843::ComputeGravityForces(ChVectorDynamic<> &, const ChVector<> &)"
               );
}

Assistant:

void ChElementHexaANCF_3843::ComputeGravityForces(ChVectorDynamic<>& Fg, const ChVector<>& G_acc) {
    assert(Fg.size() == 3 * NSF);

    // Calculate and add the generalized force due to gravity to the generalized internal force vector for the element.
    // The generalized force due to gravity could be computed once prior to the start of the simulation if gravity was
    // assumed constant throughout the entire simulation.  However, this implementation assumes that the acceleration
    // due to gravity, while a constant for the entire system, can change from step to step which could be useful for
    // gravity loaded units tests as an example.  The generalized force due to gravity is calculated in compact matrix
    // form and is pre-mapped to the desired vector format
    Eigen::Map<MatrixNx3> GravForceCompact(Fg.data(), NSF, 3);
    GravForceCompact = m_GravForceScale * G_acc.eigen().transpose();
}